

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::~TransferTestInstance
          (TransferTestInstance *this)

{
  TransferTestInstance *this_local;
  
  ~TransferTestInstance(this);
  operator_delete(this,0x200);
  return;
}

Assistant:

TransferTestInstance::~TransferTestInstance(void)
{
}